

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void tlbi_aa64_vmalle1_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  CPUState *cpu;
  _Bool _Var1;
  uint16_t idxmap;
  
  if (((env->features & 0x200000000) == 0) || (idxmap = 0x380, ((env->cp15).scr_el3 & 1) != 0)) {
    idxmap = 0xd;
    if ((~(env->cp15).hcr_el2 & 0x408000000) == 0) {
      idxmap = 0x62;
    }
  }
  cpu = (CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14);
  _Var1 = tlb_force_broadcast(env);
  if (_Var1) {
    tlb_flush_by_mmuidx_all_cpus_synced_aarch64(cpu,idxmap);
    return;
  }
  tlb_flush_by_mmuidx_aarch64(cpu,idxmap);
  return;
}

Assistant:

static void tlbi_aa64_vmalle1_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                    uint64_t value)
{
    CPUState *cs = env_cpu(env);
    int mask = vae1_tlbmask(env);

    if (tlb_force_broadcast(env)) {
        tlb_flush_by_mmuidx_all_cpus_synced(cs, mask);
    } else {
        tlb_flush_by_mmuidx(cs, mask);
    }
}